

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::TestResult::HasFatalFailure(TestResult *this)

{
  pointer pTVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  iVar2 = 0;
  for (pTVar1 = (this->test_part_results_).
                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar1 != (this->test_part_results_).
                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar1 = pTVar1 + 1) {
    iVar2 = iVar2 + (uint)(pTVar1->type_ == kFatalFailure);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar2 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool TestResult::HasFatalFailure() const {
  return CountIf(test_part_results_, TestPartFatallyFailed) > 0;
}